

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::load(ZoneStringsLoader *this,UErrorCode *status)

{
  ZNamesLoader *this_00;
  char *key;
  UHashtable *pUVar1;
  UBool UVar2;
  UHashElement *pUVar3;
  UChar **ppUVar4;
  int32_t pos;
  UnicodeString tzID;
  int32_t local_74;
  UnicodeString local_70;
  
  ures_getAllItemsWithFallback_63(this->tzn->fZoneStrings,"",&this->super_ResourceSink,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_74 = -1;
    do {
      do {
        pUVar3 = uhash_nextElement_63(this->keyToLoader,&local_74);
        if (pUVar3 == (UHashElement *)0x0) {
          return;
        }
        this_00 = (ZNamesLoader *)(pUVar3->value).pointer;
      } while (this_00 == (ZNamesLoader *)"<dummy>");
      key = (char *)(pUVar3->key).pointer;
      UVar2 = isMetaZone(this,key);
      if (UVar2 == '\0') {
        tzIDFromKey(&local_70,this,key);
        pUVar1 = this->tzn->fTZNamesMap;
        ppUVar4 = ZNames::ZNamesLoader::getNames(this_00);
        ZNames::createTimeZoneAndPutInCache(pUVar1,ppUVar4,&local_70,status);
      }
      else {
        mzIDFromKey(&local_70,this,key);
        pUVar1 = this->tzn->fMZNamesMap;
        ppUVar4 = ZNames::ZNamesLoader::getNames(this_00);
        ZNames::createMetaZoneAndPutInCache(pUVar1,ppUVar4,&local_70,status);
      }
      icu_63::UnicodeString::~UnicodeString(&local_70);
    } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
  }
  return;
}

Assistant:

void load(UErrorCode& status) {
        ures_getAllItemsWithFallback(tzn.fZoneStrings, "", *this, status);
        if (U_FAILURE(status)) { return; }

        int32_t pos = UHASH_FIRST;
        const UHashElement* element;
        while ((element = uhash_nextElement(keyToLoader, &pos)) != NULL) {
            if (element->value.pointer == DUMMY_LOADER) { continue; }
            ZNames::ZNamesLoader* loader = (ZNames::ZNamesLoader*) element->value.pointer;
            char* key = (char*) element->key.pointer;

            if (isMetaZone(key)) {
                UnicodeString mzID = mzIDFromKey(key);
                ZNames::createMetaZoneAndPutInCache(tzn.fMZNamesMap, loader->getNames(), mzID, status);
            } else {
                UnicodeString tzID = tzIDFromKey(key);
                ZNames::createTimeZoneAndPutInCache(tzn.fTZNamesMap, loader->getNames(), tzID, status);
            }
            if (U_FAILURE(status)) { return; }
        }
    }